

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  istream *piVar2;
  GLFWwindow *handle;
  GLFWmonitor *handle_00;
  ostream *poVar3;
  ulong uVar4;
  int height;
  char *pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text;
  string token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_cmds;
  string line;
  string cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  char buffer [32];
  ifstream input_stream;
  byte abStack_3a0 [488];
  stringstream ss;
  
  printf("Enter Options File (max 32 chars): ");
  __isoc99_scanf(" %32s",buffer);
  printf("Initialzed using option file [%s]\n",buffer);
  dls[0][0] = 0.0;
  dls[0][1] = 0.0;
  dls[0][2] = 0.0;
  dl_cs[0][0] = 0.0;
  dl_cs[0][1] = 0.0;
  dl_cs[0][2] = 0.0;
  pls[0][0] = 0.0;
  pls[0][1] = 0.0;
  pls[0][2] = 0.0;
  pl_cs[0][0] = 0.0;
  pl_cs[0][1] = 0.0;
  pl_cs[0][2] = 0.0;
  std::ifstream::ifstream(&input_stream,buffer,_S_in);
  if ((abStack_3a0[*(long *)(_input_stream + -0x18)] & 5) != 0) {
    printf("Can\'t open the option file, using default.");
    dls[0][0] = 1.0;
    dls[0][1] = 1.0;
    dls[0][2] = 0.8;
    dl_cs[0][0] = 0.8;
    dl_cs[0][1] = 0.8;
    dl_cs[0][2] = 0.8;
  }
  text.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  text.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  text.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&input_stream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&text,&line);
  }
  std::ifstream::close();
  for (uVar4 = 0;
      uVar4 < (ulong)((long)text.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)text.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    std::__cxx11::string::string
              ((string *)&cmd,
               (string *)
               (text.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar4));
    split_cmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    split_cmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    split_cmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&cmd,_S_out|_S_in);
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ss,(string *)&token,' ');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&split_cmds,&token);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_400,&split_cmds);
    read_cmd_tokens(&local_400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_400);
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&split_cmds);
    std::__cxx11::string::~string((string *)&cmd);
  }
  glfwInit();
  iVar1 = Height_global;
  handle = glfwCreateWindow(Width_global,Height_global,"Computer Graphics",(GLFWmonitor *)0x0,
                            (GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    pcVar5 = "Error on window creating";
  }
  else {
    handle_00 = glfwGetPrimaryMonitor();
    VideoMode_global = glfwGetVideoMode(handle_00);
    if (VideoMode_global != (GLFWvidmode *)0x0) {
      glfwMakeContextCurrent(handle);
      size_callback(handle,iVar1,height);
      glfwSetWindowSizeCallback(handle,size_callback);
      glfwSetKeyCallback(handle,key_callback);
      while( true ) {
        iVar1 = glfwWindowShouldClose(handle);
        if (iVar1 != 0) break;
        display(handle);
        glfwPollEvents();
      }
      iVar1 = 0;
      goto LAB_0010bde2;
    }
    pcVar5 = "Error on getting monitor";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  glfwTerminate();
  iVar1 = -1;
LAB_0010bde2:
  std::__cxx11::string::~string((string *)&line);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&text);
  std::ifstream::~ifstream(&input_stream);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {

    //take user input
    char buffer[32];
    printf("Enter Options File (max 32 chars): ");
    scanf(" %32s", buffer);
    printf("Initialzed using option file [%s]\n", buffer);

    //initialize lights
    vec3 zero = {0.0f, 0.0f, 0.0f};
    for(int i=0; i<5; i++){
        change_light(dls, dl_cs, 0, zero, zero);
        change_light(pls, pl_cs, 0, zero, zero);
    }

    //open option file and record variables
    ifstream input_stream(buffer);
    if(!input_stream){
        printf("Can't open the option file, using default.");
        //add a default directional light
        vec3 l = {1.0f, 1.0f, 0.8f};
        vec3 cl = {0.8f, 0.8f, 0.8f};
        change_light(dls, dl_cs, 0, l, cl);
    }
    
    //read lines for values
    vector<string> text;
    string line;
    while(getline(input_stream, line)) text.push_back(line);
    input_stream.close();
    for(int i=0; i<text.size();i++){
        string cmd = text[i];
        vector<string> split_cmds;
        stringstream ss(cmd);
        string token;
        while(getline(ss, token, ' ')) split_cmds.push_back(token);
        read_cmd_tokens(split_cmds);
    }

    //This initializes glfw
    initializeRendering();
    
    GLFWwindow* window = glfwCreateWindow( Width_global, Height_global, "Computer Graphics", NULL, NULL );
    if ( !window )
    {
        cerr << "Error on window creating" << endl;
        glfwTerminate();
        return -1;
    }
    
    VideoMode_global = glfwGetVideoMode(glfwGetPrimaryMonitor());
    if ( !VideoMode_global )
    {
        cerr << "Error on getting monitor" << endl;
        glfwTerminate();
        return -1;
    }
    
    glfwMakeContextCurrent( window );

    size_callback(window, 0, 0);
    
    glfwSetWindowSizeCallback(window, size_callback);
    glfwSetKeyCallback(window, key_callback);
                
    while( !glfwWindowShouldClose( window ) ) // main loop to draw object again and again
    {
        display( window );

        glfwPollEvents();        
    }

    return 0;
}